

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_mk_len_0_to_4(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  ulong in_RSI;
  char v;
  size_t i;
  uint32_t c;
  uint32_t b;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
  }
  mur(0,0x2b633f);
  uVar1 = mur(0,0x2b634a);
  uVar1 = fmix(uVar1);
  return uVar1;
}

Assistant:

static inline uint32_t farmhash32_mk_len_0_to_4(const char *s, size_t len, uint32_t seed) {
  uint32_t b = seed;
  uint32_t c = 9;
  size_t i;
  for (i = 0; i < len; i++) {
    signed char v = s[i];
    b = b * c1 + v;
    c ^= b;
  }
  return fmix(mur(b, mur(len, c)));
}